

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void printTimeForDebug(int choice,time_t start,time_t finish)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  int hours;
  int minutes;
  int seconds;
  long duration;
  ofstream outfile;
  char *timeFile;
  time_t finish_local;
  time_t start_local;
  int choice_local;
  
  pcVar2 = catStrStr(draftAddress,"time.txt");
  std::ofstream::ofstream(&duration,pcVar2,_S_app);
  lVar3 = finish - start;
  switch(choice) {
  case 0:
    std::operator<<((ostream *)&duration,"TOTAL Time: \n");
    break;
  case 1:
    std::operator<<((ostream *)&duration,"Cost 1 : ");
    break;
  case 2:
    std::operator<<((ostream *)&duration,"Cost 2 : ");
    break;
  case 3:
    std::operator<<((ostream *)&duration,"Transfer Time: ");
    break;
  case 4:
    std::operator<<((ostream *)&duration,"Input Time: ");
    break;
  case 5:
    std::operator<<((ostream *)&duration,"Adaption Time: ");
    break;
  case 6:
    std::operator<<((ostream *)&duration,"IntoRep Time: ");
  }
  lVar1 = lVar3 / 0x3c;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&duration,(int)(lVar1 / 0x3c));
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(int)lVar1 +
                             ((int)(SUB168(SEXT816(lVar1) * ZEXT816(0x8888888888888889),8) >> 5) -
                             (SUB164(SEXT816(lVar1) * ZEXT816(0x8888888888888889),0xc) >> 0x1f)) *
                             -0x3c);
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(int)lVar3 +
                             ((int)(SUB168(SEXT816(lVar3) * ZEXT816(0x8888888888888889),8) >> 5) -
                             (SUB164(SEXT816(lVar3) * ZEXT816(0x8888888888888889),0xc) >> 0x1f)) *
                             -0x3c);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(&duration);
  return;
}

Assistant:

void printTimeForDebug(int choice, time_t start, time_t finish){
    const char *timeFile = catStrStr(draftAddress, "time.txt");
    ofstream outfile(timeFile, ios::app);
    long duration;
    duration = finish-start;
    switch (choice){
        case 0: outfile << "TOTAL Time: \n"; break;
        case 1: outfile << "Cost 1 : "; break;
        case 2: outfile << "Cost 2 : "; break;
        case 3: outfile << "Transfer Time: "; break;
        case 4: outfile << "Input Time: "; break;
        case 5: outfile << "Adaption Time: "; break;
        case 6: outfile << "IntoRep Time: "; break;
        default: break;
    }
    int seconds = duration % 60;
    duration /= 60;
    int minutes = duration % 60;
    duration /= 60;
    int hours = duration;

    outfile << hours << ":" << minutes << ":" << seconds << endl;
    outfile.close();
}